

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err http_server_start(nni_http_server *s)

{
  uint32_t local_20;
  nng_err local_1c;
  int port;
  nng_err rv;
  nni_http_server *s_local;
  
  _port = s;
  local_1c = nng_stream_listener_listen(s->listener);
  s_local._4_4_ = local_1c;
  if (local_1c == NNG_OK) {
    if (_port->port == 0) {
      nng_stream_listener_get_int(_port->listener,"tcp-bound-port",(int *)&local_20);
      _port->port = local_20;
    }
    nng_stream_listener_accept(_port->listener,&_port->accaio);
    s_local._4_4_ = NNG_OK;
  }
  return s_local._4_4_;
}

Assistant:

static nng_err
http_server_start(nni_http_server *s)
{
	nng_err rv;
	if ((rv = nng_stream_listener_listen(s->listener)) != 0) {
		return (rv);
	}
	if (s->port == 0) {
		int port;
		nng_stream_listener_get_int(
		    s->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		s->port = (uint32_t) port;
	}
	nng_stream_listener_accept(s->listener, &s->accaio);
	return (NNG_OK);
}